

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_truncated_cone_dist(REF_DBL *cone_geom,REF_DBL *p,REF_DBL *dist)

{
  double dVar1;
  uint uVar2;
  REF_DBL *pRVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dd;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined8 uVar13;
  double dVar14;
  REF_DBL u [3];
  REF_DBL pa [3];
  REF_DBL a [3];
  REF_DBL ba [3];
  REF_DBL b [3];
  double local_e8 [4];
  undefined1 local_c8 [16];
  double local_b8 [4];
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  REF_DBL local_78 [4];
  double local_58 [4];
  REF_DBL local_38 [3];
  
  dVar8 = cone_geom[6];
  dVar1 = cone_geom[7];
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  if (dVar1 <= -dVar1) {
    dVar1 = -dVar1;
  }
  if (dVar1 <= dVar8) {
    local_78[2] = cone_geom[2];
    local_78[0] = *cone_geom;
    local_78[1] = cone_geom[1];
    pRVar3 = cone_geom + 3;
    dVar14 = dVar1;
  }
  else {
    local_78[2] = cone_geom[5];
    local_78[0] = cone_geom[3];
    local_78[1] = cone_geom[4];
    pRVar3 = cone_geom;
    dVar14 = dVar8;
    dVar8 = dVar1;
  }
  local_38[2] = pRVar3[2];
  local_38[0] = *pRVar3;
  local_38[1] = pRVar3[1];
  lVar4 = 0;
  do {
    dVar1 = *(double *)((long)local_38 + lVar4) - *(double *)((long)local_78 + lVar4);
    *(double *)((long)local_58 + lVar4) = dVar1;
    *(double *)((long)local_e8 + lVar4) = dVar1;
    *(double *)((long)local_b8 + lVar4) =
         *(double *)((long)p + lVar4) - *(double *)((long)local_78 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  uVar5 = 0;
  uVar6 = 0;
  dVar1 = local_58[2] * local_58[2] + local_58[0] * local_58[0] + local_58[1] * local_58[1];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
    uVar5 = extraout_XMM0_Dc;
    uVar6 = extraout_XMM0_Dd;
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar10 = dVar1 * 1e+20;
  if (dVar10 <= -dVar10) {
    dVar10 = -dVar10;
  }
  dVar11 = local_e8[0];
  if (local_e8[0] <= -local_e8[0]) {
    dVar11 = -local_e8[0];
  }
  if (dVar10 <= dVar11) {
LAB_001a8b96:
    dVar1 = local_b8[2] * local_b8[2] + local_b8[0] * local_b8[0] + local_b8[1] * local_b8[1];
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    if (dVar8 <= dVar14) {
      dVar8 = dVar14;
    }
    dVar14 = 0.0;
    if (0.0 <= dVar1 - dVar8) {
      dVar14 = dVar1 - dVar8;
    }
    *dist = dVar14;
    return 0;
  }
  dVar11 = local_e8[1];
  if (local_e8[1] <= -local_e8[1]) {
    dVar11 = -local_e8[1];
  }
  if (dVar10 <= dVar11) goto LAB_001a8b96;
  dVar11 = local_e8[2];
  if (local_e8[2] <= -local_e8[2]) {
    dVar11 = -local_e8[2];
  }
  if (dVar10 <= dVar11) goto LAB_001a8b96;
  local_c8._8_4_ = uVar5;
  local_c8._0_8_ = dVar1;
  local_c8._12_4_ = uVar6;
  uVar2 = ref_math_normalize(local_e8);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xcc3,
           "ref_metric_truncated_cone_dist",(ulong)uVar2,"axis length zero");
    ref_metric_tattle_truncated_cone_dist(cone_geom,p);
    return uVar2;
  }
  dVar10 = local_e8[2] * local_b8[2] + local_e8[0] * local_b8[0] + local_e8[1] * local_b8[1];
  dVar1 = local_b8[2] * local_b8[2] + local_b8[0] * local_b8[0] + local_b8[1] * local_b8[1];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar11 = 0.0;
  dVar12 = dVar10 * dVar10;
  dVar1 = dVar1 * dVar1 - dVar12;
  uVar13 = 0;
  if (0.0 < dVar1) {
    if (dVar1 < 0.0) {
      uStack_80 = 0;
      local_98 = dVar1;
      local_88 = dVar12;
      dVar11 = sqrt(dVar1);
      dVar12 = local_88;
      uVar13 = uStack_80;
      dVar1 = local_98;
    }
    else {
      dVar11 = SQRT(dVar1);
    }
  }
  if (0.0 <= dVar10) {
    if (dVar1 < dVar14 * dVar14) {
      if ((double)local_c8._0_8_ < dVar10) {
        *dist = dVar10 - (double)local_c8._0_8_;
        return 0;
      }
      *dist = 0.0;
      return 0;
    }
    dVar14 = dVar8 - dVar14;
    dVar1 = (double)local_c8._0_8_ * (double)local_c8._0_8_ + dVar14 * dVar14;
    if (dVar1 < 0.0) {
      local_98 = dVar14;
      uStack_90 = 0;
      local_88 = dVar12;
      uStack_80 = uVar13;
      dVar1 = sqrt(dVar1);
      dVar12 = local_88;
      dVar14 = local_98;
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar7 = dVar1 * 1e+20;
    if (dVar7 <= -dVar7) {
      dVar7 = -dVar7;
    }
    uVar5 = (undefined4)((ulong)dVar14 >> 0x20);
    if (dVar14 <= -dVar14) {
      uVar5 = (undefined4)((ulong)-dVar14 >> 0x20);
    }
    if (dVar7 < (double)CONCAT44(uVar5,SUB84(dVar14,0)) ||
        dVar7 == (double)CONCAT44(uVar5,SUB84(dVar14,0))) {
LAB_001a8e8f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xce4,"ref_metric_truncated_cone_dist","div zero forming i and j");
      ref_metric_tattle_truncated_cone_dist(cone_geom,p);
      return 1;
    }
    dVar9 = (double)local_c8._0_8_;
    if ((double)local_c8._0_8_ <= -(double)local_c8._0_8_) {
      dVar9 = -(double)local_c8._0_8_;
    }
    if (dVar7 <= dVar9) goto LAB_001a8e8f;
    dVar11 = dVar11 - dVar8;
    dVar8 = dVar10 * ((double)local_c8._0_8_ / dVar1) - (dVar14 / dVar1) * dVar11;
    if (dVar8 <= 0.0) {
      dVar12 = dVar11 * dVar11 + dVar12;
      goto joined_r0x001a8ed8;
    }
    dVar14 = dVar10 * (dVar14 / dVar1) + dVar11 * ((double)local_c8._0_8_ / dVar1);
    if (dVar8 < dVar1) {
      dVar8 = 0.0;
      if (0.0 <= dVar14) {
        dVar8 = dVar14;
      }
      goto LAB_001a8ee7;
    }
    dVar12 = dVar14 * dVar14 + (dVar8 - dVar1) * (dVar8 - dVar1);
    if (0.0 <= dVar12) {
      dVar8 = SQRT(dVar12);
      goto LAB_001a8ee7;
    }
  }
  else {
    if (dVar1 < dVar8 * dVar8) {
      *dist = -dVar10;
      return 0;
    }
    dVar12 = (dVar11 - dVar8) * (dVar11 - dVar8) + dVar12;
joined_r0x001a8ed8:
    if (0.0 <= dVar12) {
      dVar8 = SQRT(dVar12);
      goto LAB_001a8ee7;
    }
  }
  dVar8 = sqrt(dVar12);
LAB_001a8ee7:
  *dist = dVar8;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_truncated_cone_dist(REF_DBL *cone_geom,
                                                  REF_DBL *p, REF_DBL *dist) {
  REF_INT d;
  REF_DBL a[3], b[3], ba[3], u[3], pa[3], l, x, y, y2, n, ra, rb, delta, s;
  REF_DBL xprime, yprime;
  REF_BOOL verbose = REF_FALSE;
  if (verbose) printf("\np %f %f %f\n", p[0], p[1], p[2]);
  if (ABS(cone_geom[6]) >= ABS(cone_geom[7])) {
    ra = ABS(cone_geom[6]);
    rb = ABS(cone_geom[7]);
    for (d = 0; d < 3; d++) {
      a[d] = cone_geom[d];
      b[d] = cone_geom[d + 3];
    }
    if (verbose) printf("forward ra %f rb %f\n", ra, rb);
  } else {
    ra = ABS(cone_geom[7]);
    rb = ABS(cone_geom[6]);
    for (d = 0; d < 3; d++) {
      a[d] = cone_geom[d + 3];
      b[d] = cone_geom[d];
    }
    if (verbose) printf("reverse ra %f rb %f\n", ra, rb);
  }
  if (verbose) printf("a %f %f %f\n", a[0], a[1], a[2]);
  if (verbose) printf("b %f %f %f\n", b[0], b[1], b[2]);
  for (d = 0; d < 3; d++) {
    ba[d] = b[d] - a[d];
    u[d] = ba[d];
    pa[d] = p[d] - a[d]; /* direction flip, error in paper? */
  }
  l = sqrt(ref_math_dot(ba, ba));
  if (!ref_math_divisible(u[0], l) || !ref_math_divisible(u[1], l) ||
      !ref_math_divisible(u[2], l)) { /* assume sphere */
    REF_DBL r;
    r = sqrt(pa[0] * pa[0] + pa[1] * pa[1] + pa[2] * pa[2]);
    *dist = MAX(0, r - MAX(ra, rb));
    return REF_SUCCESS;
  }
  RSB(ref_math_normalize(u), "axis length zero",
      { ref_metric_tattle_truncated_cone_dist(cone_geom, p); });
  x = ref_math_dot(pa, u); /* sign flip, error in paper? */
  n = sqrt(ref_math_dot(pa, pa));
  y2 = n * n - x * x;
  if (verbose) printf("n2 %f x2 %f y2 %f\n", n * n, x * x, y2);
  if (y2 <= 0) {
    y = 0;
  } else {
    y = sqrt(y2);
  }
  if (verbose) printf("x %f y %f l %f\n", x, y, l);
  if (x < 0) {
    if (y2 < ra * ra) {
      *dist = -x;
      return REF_SUCCESS;
    } else {
      *dist = sqrt((y - ra) * (y - ra) + x * x);
      return REF_SUCCESS;
    }
  }
  if (y2 < rb * rb) {
    if (x > l) {
      *dist = x - l;
      return REF_SUCCESS;
    } else {
      *dist = 0;
      return REF_SUCCESS;
    }
  }
  delta = ra - rb;
  s = sqrt(l * l + delta * delta);
  RAB(ref_math_divisible(delta, s) && ref_math_divisible(l, s),
      "div zero forming i and j",
      { ref_metric_tattle_truncated_cone_dist(cone_geom, p); });
  if (verbose) printf("l/s %f delta/s %f\n", l / s, delta / s);
  xprime = x * (l / s) - (y - ra) * (delta / s);
  yprime = x * (delta / s) + (y - ra) * (l / s);
  if (verbose) printf("xprime %f yprime %f\n", xprime, yprime);
  if (xprime <= 0) {
    *dist = sqrt((y - ra) * (y - ra) + x * x);
    return REF_SUCCESS;
  }
  if (xprime >= s) {
    *dist = sqrt(yprime * yprime + (xprime - s) * (xprime - s));
    return REF_SUCCESS;
  }
  *dist = MAX(0, yprime);
  return REF_SUCCESS;
}